

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjToBool(jx9_value *pObj)

{
  uint uVar1;
  sxu32 sVar2;
  int iVar3;
  jx9_hashmap *pMap;
  sxi32 sVar4;
  anon_union_8_3_18420de5_for_x aVar5;
  char *zLeft;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 8) != 0) {
    return 0;
  }
  if ((uVar1 & 4) != 0) {
    bVar8 = (bool)(-((pObj->x).rVal != 0.0) & 1);
    goto LAB_0011f8e1;
  }
  if ((uVar1 & 2) != 0) {
LAB_0011f7b5:
    bVar8 = (pObj->x).iVal == 0;
LAB_0011f7b9:
    bVar8 = !bVar8;
    goto LAB_0011f8e1;
  }
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 0x40) != 0) {
        pMap = (jx9_hashmap *)(pObj->x).iVal;
        sVar2 = pMap->nEntry;
        iVar3 = pMap->iRef;
        pMap->iRef = iVar3 + -1;
        if (iVar3 < 2) {
          jx9HashmapRelease(pMap,1);
        }
        bVar8 = sVar2 == 0;
        goto LAB_0011f7b9;
      }
      if ((uVar1 >> 8 & 1) != 0) goto LAB_0011f7b5;
    }
  }
  else {
    uVar1 = (pObj->sBlob).nByte;
    uVar6 = (ulong)uVar1;
    if (uVar6 != 0) {
      zLeft = (char *)(pObj->sBlob).pBlob;
      switch(uVar1) {
      case 2:
switchD_0011f803_caseD_2:
        sVar4 = SyStrnicmp(zLeft,"on",2);
        if (sVar4 == 0) goto LAB_0011f90b;
        if (uVar6 == 5) goto switchD_0011f803_caseD_5;
        if (uVar1 == 3) goto switchD_0011f803_caseD_3;
        break;
      case 3:
switchD_0011f803_caseD_3:
        sVar4 = SyStrnicmp(zLeft,"yes",3);
        if (sVar4 == 0) {
LAB_0011f90b:
          bVar8 = true;
          goto LAB_0011f8e1;
        }
        if (uVar1 == 5) goto switchD_0011f803_caseD_5;
        break;
      case 4:
        sVar4 = SyStrnicmp(zLeft,"true",4);
        if (sVar4 == 0) goto LAB_0011f90b;
        if (uVar6 == 5) goto switchD_0011f803_caseD_5;
        if (uVar1 == 3) goto switchD_0011f803_caseD_3;
        if (uVar1 == 2) goto switchD_0011f803_caseD_2;
        break;
      case 5:
switchD_0011f803_caseD_5:
        sVar4 = SyStrnicmp(zLeft,"false",5);
        if (sVar4 == 0) goto LAB_0011f8df;
      }
      bVar8 = true;
      if (*zLeft == '0') {
        pcVar7 = zLeft + uVar6;
        do {
          zLeft = zLeft + 1;
          bVar8 = zLeft < pcVar7;
          if (!bVar8) break;
        } while (*zLeft == '0');
      }
      goto LAB_0011f8e1;
    }
  }
LAB_0011f8df:
  bVar8 = false;
LAB_0011f8e1:
  aVar5.iVal._1_7_ = 0;
  aVar5.iVal._0_1_ = bVar8;
  pObj->x = aVar5;
  SyBlobRelease(&pObj->sBlob);
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToBool(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_BOOL) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjBooleanValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_BOOL);
	}
	return SXRET_OK;
}